

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module_file_server.cpp
# Opt level: O2

int module_load(Server *server)

{
  key_type *__k;
  _Alloc_hider _Var1;
  size_type sVar2;
  bool bVar3;
  DIR *__dirp;
  dirent *pdVar4;
  ostream *poVar5;
  _Tuple_impl<0UL,_const_char_*,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p_Var6;
  _List_node_base *p_Var7;
  _List_node_base *p_Var8;
  allocator local_109;
  string s;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  file_list;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  todo;
  value_type item;
  value_type local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  puts("Loading module FileServer...");
  std::__cxx11::string::string((string *)&local_90,"static",&local_109);
  file_list.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&file_list;
  file_list.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  todo.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&todo;
  todo.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_allocated_capacity = s.field_2._M_allocated_capacity & 0xffffffffffffff00;
  file_list.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       file_list.
       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  todo.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       todo.
       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)todo.
                 super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl._M_node.super__List_node_base._M_next,&local_90);
  while (todo.
         super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl._M_node._M_size != 0) {
    std::__cxx11::string::string
              ((string *)&item,
               (string *)
               (todo.
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_prev + 1));
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back(&todo);
    __dirp = opendir(item._M_dataplus._M_p);
    if (__dirp != (DIR *)0x0) {
      while (pdVar4 = readdir(__dirp), pdVar4 != (dirent *)0x0) {
        std::__cxx11::string::assign((char *)&s);
        bVar3 = std::operator==(&s,".");
        if (((!bVar3) && (bVar3 = std::operator==(&s,".."), !bVar3)) && (*s._M_dataplus._M_p != '.')
           ) {
          if (pdVar4->d_type == '\x04') {
            std::operator+(&local_50,&item,"/");
            std::operator+(&local_70,&local_50,&s);
            std::__cxx11::
            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&todo,&local_70);
          }
          else {
            if (pdVar4->d_type != '\b') {
              fprintf(_stderr,"%s:%d\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Fugoes[P]Webe/src/modules/module_file_server.cpp"
                      ,0x3a);
              fprintf(_stderr,"--> %s\n","false");
              perror("info");
              exit(1);
            }
            std::operator+(&local_50,&item,"/");
            std::operator+(&local_70,&local_50,&s);
            std::__cxx11::
            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&file_list,&local_70);
          }
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_50);
        }
      }
      closedir(__dirp);
    }
    std::__cxx11::string::~string((string *)&item);
  }
  std::__cxx11::string::~string((string *)&s);
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&todo.
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
  std::__cxx11::string::~string((string *)&local_90);
  p_Var8 = (_List_node_base *)&file_list;
LAB_00105a8b:
  while( true ) {
    p_Var8 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&p_Var8->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var8 == (_List_node_base *)&file_list) {
      std::__cxx11::
      _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_clear(&file_list.
                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                );
      Server::insert_to_front_of_hook<HTTPResponse*(*)(Client*)>
                ((vector<HTTPResponse_*(*)(Client_*),_std::allocator<HTTPResponse_*(*)(Client_*)>_>
                  *)server,http_request_handler);
      puts("Loaded module FileServer");
      return 0;
    }
    __k = (key_type *)(p_Var8 + 1);
    p_Var7 = p_Var8[1]._M_prev;
    if (p_Var7 < (_List_node_base *)0x7) break;
    std::__cxx11::string::substr((ulong)&s,(ulong)__k);
    bVar3 = std::operator==(&s,".html");
    std::__cxx11::string::~string((string *)&s);
    if (!bVar3) {
      p_Var7 = p_Var8[1]._M_prev;
      break;
    }
    load_file(&s);
    sVar2 = s._M_string_length;
    _Var1 = s._M_dataplus;
    poVar5 = std::operator<<((ostream *)&std::cout,(string *)__k);
    std::endl<char,std::char_traits<char>>(poVar5);
    s._M_dataplus._M_p = "text/html";
    s._M_string_length = (size_type)_Var1._M_p;
    s.field_2._M_allocated_capacity = sVar2;
    p_Var6 = &std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<const_char_*,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<const_char_*,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::operator[](&filename_to_buffer_abi_cxx11_,__k)->
              super__Tuple_impl<0UL,_const_char_*,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ;
    std::_Tuple_impl<0ul,char_const*,long,std::__cxx11::string>::
    _M_assign<char_const*,long,char_const*>
              (p_Var6,(_Tuple_impl<0UL,_const_char_*,_long,_const_char_*> *)&s);
  }
  if ((_List_node_base *)0x5 < p_Var7) {
    std::__cxx11::string::substr((ulong)&s,(ulong)__k);
    bVar3 = std::operator==(&s,".css");
    std::__cxx11::string::~string((string *)&s);
    if (bVar3) {
      load_file(&s);
      sVar2 = s._M_string_length;
      _Var1 = s._M_dataplus;
      poVar5 = std::operator<<((ostream *)&std::cout,(string *)__k);
      std::endl<char,std::char_traits<char>>(poVar5);
      s._M_dataplus._M_p = "text/css";
      s._M_string_length = (size_type)_Var1._M_p;
      s.field_2._M_allocated_capacity = sVar2;
      p_Var6 = &std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<const_char_*,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<const_char_*,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::operator[](&filename_to_buffer_abi_cxx11_,__k)->
                super__Tuple_impl<0UL,_const_char_*,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ;
      std::_Tuple_impl<0ul,char_const*,long,std::__cxx11::string>::
      _M_assign<char_const*,long,char_const*>
                (p_Var6,(_Tuple_impl<0UL,_const_char_*,_long,_const_char_*> *)&s);
      goto LAB_00105a8b;
    }
    p_Var7 = p_Var8[1]._M_prev;
  }
  if ((_List_node_base *)0x4 < p_Var7) {
    std::__cxx11::string::substr((ulong)&s,(ulong)__k);
    bVar3 = std::operator==(&s,".js");
    std::__cxx11::string::~string((string *)&s);
    if (bVar3) {
      load_file(&s);
      sVar2 = s._M_string_length;
      _Var1 = s._M_dataplus;
      poVar5 = std::operator<<((ostream *)&std::cout,(string *)__k);
      std::endl<char,std::char_traits<char>>(poVar5);
      s._M_dataplus._M_p = "application/javascript";
      s._M_string_length = (size_type)_Var1._M_p;
      s.field_2._M_allocated_capacity = sVar2;
      p_Var6 = &std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<const_char_*,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<const_char_*,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::operator[](&filename_to_buffer_abi_cxx11_,__k)->
                super__Tuple_impl<0UL,_const_char_*,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ;
      std::_Tuple_impl<0ul,char_const*,long,std::__cxx11::string>::
      _M_assign<char_const*,long,char_const*>
                (p_Var6,(_Tuple_impl<0UL,_const_char_*,_long,_const_char_*> *)&s);
    }
  }
  goto LAB_00105a8b;
}

Assistant:

int module_load(Server *server) {
    printf("Loading module FileServer...\n");
    load_file_into_mem();
    Server::insert_to_front_of_hook(server->http_request_hook, &http_request_handler);
    printf("Loaded module FileServer\n");
    return 0;
}